

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O0

string * Imf_3_4::channelInOtherView
                   (string *channelName,ChannelList *channelList,StringVector *multiView,
                   string *otherViewName)

{
  bool bVar1;
  __type _Var2;
  string *in_RDI;
  string *unaff_retaddr;
  string *in_stack_00000008;
  ConstIterator i;
  ChannelList *in_stack_fffffffffffffee8;
  ConstIterator *in_stack_fffffffffffffef0;
  undefined6 in_stack_ffffffffffffff08;
  byte in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  allocator<char> local_b5;
  allocator<char> local_b4;
  byte local_b3;
  byte local_b2;
  undefined1 local_b1 [49];
  StringVector *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string local_58 [32];
  const_iterator local_38;
  const_iterator local_30;
  string *multiView_00;
  
  multiView_00 = in_RDI;
  local_30._M_node = (_Base_ptr)ChannelList::begin(in_stack_fffffffffffffee8);
  while( true ) {
    local_38._M_node = (_Base_ptr)ChannelList::end(in_stack_fffffffffffffee8);
    bVar1 = operator!=(in_stack_fffffffffffffef0,(ConstIterator *)in_stack_fffffffffffffee8);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      std::allocator<char>::~allocator(&local_b5);
      return in_RDI;
    }
    in_stack_ffffffffffffff28 = ChannelList::ConstIterator::name((ConstIterator *)0x213ec1);
    in_stack_ffffffffffffff30 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffff87;
    std::allocator<char>::allocator();
    local_b2 = 0;
    local_b3 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    viewFromChannelName(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    _Var2 = std::operator==(in_stack_ffffffffffffff10,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff0f,
                                     CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)))
    ;
    in_stack_ffffffffffffff0e = false;
    if (_Var2) {
      ChannelList::ConstIterator::name((ConstIterator *)0x213f4b);
      in_stack_ffffffffffffff10 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b1;
      std::allocator<char>::allocator();
      local_b2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff20));
      local_b3 = 1;
      in_stack_ffffffffffffff0f =
           areCounterparts(in_stack_00000008,unaff_retaddr,(StringVector *)multiView_00);
      in_stack_ffffffffffffff0e = in_stack_ffffffffffffff0f;
    }
    in_stack_ffffffffffffff27 = in_stack_ffffffffffffff0e;
    if ((local_b3 & 1) != 0) {
      std::__cxx11::string::~string((string *)(local_b1 + 1));
    }
    if ((local_b2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_b1);
    }
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
    if ((in_stack_ffffffffffffff0e & 1) != 0) break;
    ChannelList::ConstIterator::operator++(in_stack_fffffffffffffef0);
  }
  ChannelList::ConstIterator::name((ConstIterator *)0x21401a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  std::allocator<char>::~allocator(&local_b4);
  return in_RDI;
}

Assistant:

string
channelInOtherView (
    const string&       channelName,
    const ChannelList&  channelList,
    const StringVector& multiView,
    const string&       otherViewName)
{
    //
    // Given the name of a channel in one view, return the
    // corresponding channel name for view otherViewName.
    //

    for (ChannelList::ConstIterator i = channelList.begin ();
         i != channelList.end ();
         ++i)
    {
        if (viewFromChannelName (i.name (), multiView) == otherViewName &&
            areCounterparts (i.name (), channelName, multiView))
        {
            return i.name ();
        }
    }

    return "";
}